

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::currencySymbol(QString *__return_storage_ptr__,QLocale *this,CurrencySymbolFormat format)

{
  ushort uVar1;
  Data *pDVar2;
  QSystemLocale *pQVar3;
  void *pvVar4;
  QLocaleData *pQVar5;
  char16_t *pcVar6;
  ulong size;
  QString *this_00;
  char *__s;
  long in_FS_OFFSET;
  QByteArrayView ba;
  undefined1 local_70 [64];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &systemLocaleData;
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    pQVar5 = (QLocaleData *)local_70;
    ::QVariant::QVariant((QVariant *)pQVar5,format);
    (*pQVar3->_vptr_QSystemLocale[2])(local_70 + 0x20,pQVar3,0x1f);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)(local_70 + 0x20));
    ::QVariant::~QVariant((QVariant *)(local_70 + 0x20));
    ::QVariant::~QVariant((QVariant *)local_70);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0031322a;
    pDVar2 = (__return_storage_ptr__->d).d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (format == CurrencyIsoCode) {
    __s = ((this->d).d.ptr)->m_data->m_currency_iso_code;
    pvVar4 = memchr(__s,0,3);
    this_00 = (QString *)((long)pvVar4 - (long)__s);
    if (pvVar4 == (void *)0x0) {
      this_00 = (QString *)0x3;
    }
    if (this_00 != (QString *)0x0) {
      if ((long)this_00 < 0) {
        this_00 = (QString *)strlen(__s);
      }
      ba.m_data = (storage_type *)pQVar5;
      ba.m_size = (qsizetype)__s;
      QString::fromLatin1(__return_storage_ptr__,this_00,ba);
      goto LAB_0031322a;
    }
  }
  else if (format == CurrencyDisplayName) {
    pQVar5 = ((this->d).d.ptr)->m_data;
    size = (ulong)pQVar5->m_currencyDisplayName_size;
    if (size != 0) {
      uVar1 = pQVar5->m_currencyDisplayName_idx;
      pcVar6 = 
      L"Suid-Afrikaanse randNamibiese dollarCFA Fàlâŋ BEACGhana SidiFrânke CFALeku shqiptarEurojaDenari maqedonasየኢትዮጵያ ብርجنيه مصريدينار جزائريدينار بحرينيفرنك وسط أفريقيفرنك جزر القمرفرنك جيبوتيناكفا أريتريدينار عراقيشيكل إسرائيلي جديددينار أردنيدينار كويتيجنيه لبنانيدينار ليبيأوقية موريتانيةدرهم مغربيريال عمانيريال قطريريال سعوديشلن صوماليجنيه جنوب السودانجنيه سودانيليرة سوريةدينار تونسيدرهم إماراتيريال يمنيeuroհայկական դրամভাৰতীয় ৰুপীshilingi ya TandhaniaAmanAzərbaycan Manatıманатfráŋsefa Fraŋ (BCEAO)বাংলাদেশী টাকাভারতীয় রুপিFrǎŋ CFA (BEAC)euroaбеларускі рубельShilingi ya Hutanzaniaभारतनि रुपीBosanskohercegovačka konvertibilna markaКонвертибилна маркаБългарски левမြန်မာ ကျပ်港幣人民币人民幣Philippine PesoDerhem Umeṛṛukiدیناری عێراقیڕیاڵی ئێرانی𑄝𑄁𑄣𑄘𑄬𑄥𑄨 𑄑𑄬𑄋𑄃𑄨𑄚𑄴𑄘𑄨𑄠𑄚𑄴 𑄢𑄪𑄛𑄨Российн сомUS ᎠᏕᎳEshiringi ya Uganda港元澳门币马来西亚令吉新加坡元澳門元馬來西亞令吉新台幣рѡссі́йскїй рꙋ́бльРаҫҫей тенкӗčeská korunadansk kroneभारती रपेऽArubaanse guldenAmerikaanse dollarCaribische guldenSurinaamse dollarདངུལ་ཀྲམShilingi ya KenyaUS DollarEast Caribbean DollarAustralian DollarBahamian DollarBarbadian DollarBelize DollarBermudian DollarBotswanan PulaBurundian FrancCentral African CFA FrancCanadian DollarCayman Islands DollarNew Zealand DollarDanish KroneEritrean NakfaSwazi LilangeniFalkland Islands PoundFijian DollarGambian DalasiGhanaian CediGibraltar PoundUK PoundGuyanaese DollarHong Kong DollarIndian RupeeIndonesian RupiahIsraeli New ShekelJamaican DollarKenyan ShillingSouth African RandLiberian DollarMacanese PatacaMalagasy AriaryMalawian KwachaMalaysian RinggitMaldivian RufiyaaMauritian RupeeNamibian DollarNigerian NairaPakistani RupeePapua New Guinean KinaRwandan FrancSt Helena PoundSamoan TalaSeychellois RupeeSierra Leonean LeoneSingapore DollarCaribbean guilderSolomon Islands DollarSouth Sudanese PoundSudanese PoundSwedish KronaSwiss FrancTanzanian ShillingTongan PaʻangaTrinidad & Tobago DollarUgandan ShillingUnited Arab Emirates DirhamBritish PoundVanuatu VatuZambian KwachaZimbabwean Goldghana siɖiɣetoɖofe afrikaga CFA franc BCEAOFəláŋ CFA ..." /* TRUNCATED STRING LITERAL */
      ;
LAB_003131c3:
      QString::fromRawData((QChar *)(pcVar6 + uVar1),size);
      goto LAB_0031322a;
    }
  }
  else if (format == CurrencySymbol) {
    pQVar5 = ((this->d).d.ptr)->m_data;
    size = (ulong)pQVar5->m_currencySymbol_size;
    if (size != 0) {
      uVar1 = pQVar5->m_currencySymbol_idx;
      pcVar6 = 
      L"₾BrFdjNfkR$FCFAGH₵Lekë€denብርج.م.\x200fد.ج.\x200fد.ب.\x200fد.ع.\x200f₪د.أ.\x200fد.ك.\x200fل.ل.\x200fد.ل.\x200fأ.م.د.م.\x200fر.ع.\x200fر.ق.\x200fر.س.\x200fS£ج.س.ل.س.\x200fد.ت.\x200fد.إ.\x200fر.ي.\x200f֏₹TSh₦₼₺F\x202fCFA৳₽KKMКМлв.HK$￥CN¥₱UShMOP$RMEURKčkr.ރ.Afl.Cg.Nu.KshUS$FBuDRpArMKRfRsRFWS$SRT$VTDAFCFPFGUMLSDT𞤅𞤊𞤀𞤊𞤅𞤊𞤀₲FtCA$\x200b₸៛Q₩сом₭Kzден.MTn₮नेरू߿؋ریالzłDbS/Bslei₴රු.₡RD$C$B/.Gs.Bs.S₫сом.Rs.NT$฿soʻmсўмPKRS"
      ;
      goto LAB_003131c3;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0031322a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::currencySymbol(CurrencySymbolFormat format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::CurrencySymbol, format).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    switch (format) {
    case CurrencySymbol:
        return d->m_data->currencySymbol().getData(currency_symbol_data);
    case CurrencyDisplayName:
        return d->m_data->currencyDisplayName().getData(currency_display_name_data);
    case CurrencyIsoCode: {
        const char *code = d->m_data->m_currency_iso_code;
        if (auto len = qstrnlen(code, 3))
            return QString::fromLatin1(code, qsizetype(len));
        break;
    }
    }
    return QString();
}